

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O0

void __thiscall PageStack<FinalizableObject_*>::Clear(PageStack<FinalizableObject_*> *this)

{
  PageStack<FinalizableObject_*> *this_local;
  
  this->currentChunk = (Chunk *)0x0;
  this->nextEntry = (FinalizableObject **)0x0;
  this->count = 0;
  this->pageCount = 0;
  return;
}

Assistant:

void PageStack<T>::Clear()
{
    currentChunk = nullptr;
    nextEntry = nullptr;
#if DBG
    count = 0;
    pageCount = 0;
#endif
}